

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_cpp.cpp
# Opt level: O2

string * __thiscall
flatbuffers::cpp::CppGenerator::TableUnPackToSignature_abi_cxx11_
          (string *__return_storage_ptr__,CppGenerator *this,StructDef *struct_def,bool inclass,
          IDLOptions *opts)

{
  undefined7 in_register_00000009;
  char *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  string local_150;
  string local_130;
  string local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if ((int)CONCAT71(in_register_00000009,inclass) == 0) {
    EscapeKeyword(&local_110,this,(string *)struct_def);
    std::operator+(&local_170,&local_110,"::");
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_170,"",(allocator<char> *)&local_110);
  }
  std::operator+(&local_f0,"void ",&local_170);
  std::operator+(&local_d0,&local_f0,"UnPackTo(");
  EscapeKeyword(&local_150,this,(string *)struct_def);
  NativeName(&local_130,&local_150,struct_def,opts);
  std::operator+(&local_b0,&local_d0,&local_130);
  std::operator+(&local_90,&local_b0," *");
  std::operator+(&local_70,&local_90,"_o, const ::flatbuffers::resolver_function_t *_resolver");
  __rhs = "";
  if (inclass) {
    __rhs = " = nullptr";
  }
  std::operator+(&local_50,&local_70,__rhs);
  std::operator+(__return_storage_ptr__,&local_50,") const");
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_130);
  std::__cxx11::string::~string((string *)&local_150);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::~string((string *)&local_170);
  if (!inclass) {
    std::__cxx11::string::~string((string *)&local_110);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string TableUnPackToSignature(const StructDef &struct_def, bool inclass,
                                     const IDLOptions &opts) {
    return "void " + (inclass ? "" : Name(struct_def) + "::") + "UnPackTo(" +
           NativeName(Name(struct_def), &struct_def, opts) + " *" +
           "_o, const ::flatbuffers::resolver_function_t *_resolver" +
           (inclass ? " = nullptr" : "") + ") const";
  }